

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
::~TagVisitor(TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              *this)

{
  char *pcVar1;
  pointer ppcVar2;
  
  reportBadObjLib(&this->BadObjLibFiles,this->Target,this->GlobalGenerator->CMakeInstance);
  pcVar1 = (this->Header).program;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  ppcVar2 = (this->BadObjLibFiles).
            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->BadObjLibFiles).
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
    return;
  }
  return;
}

Assistant:

~TagVisitor()
  {
    reportBadObjLib(this->BadObjLibFiles, this->Target,
                    this->GlobalGenerator->GetCMakeInstance());
  }